

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase321::run(TestCase321 *this)

{
  Builder builder;
  PromiseNode *pPVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  Iface *pIVar3;
  long *plVar4;
  ElementCount index;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  Own<kj::AsyncOutputStream> output;
  PipeWithSmallBuffer fds;
  AsyncIoContext ioContext;
  Builder list;
  Thread thread;
  Builder root;
  Builder element;
  TestMessageBuilder message;
  Own<kj::_::PromiseNode> local_368;
  undefined8 *local_358;
  ArrayPtr<const_capnp::word> *local_350;
  PipeWithSmallBuffer local_348;
  Function<void_()> local_340;
  undefined8 *local_330;
  long *local_328;
  undefined8 *local_320;
  long *local_318;
  WaitScope *local_310;
  ListBuilder local_300;
  Thread local_2d8;
  SegmentBuilder *local_2c0;
  CapTableBuilder *pCStackY_2b8;
  WirePointer *local_2a8;
  undefined8 in_stack_fffffffffffffd60;
  bool bVar6;
  undefined7 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 in_stack_fffffffffffffd80;
  TestMessageBuilder local_128;
  
  PipeWithSmallBuffer::PipeWithSmallBuffer(&local_348);
  kj::setupAsyncIo();
  (**(code **)(*local_328 + 8))(&local_358,local_328,local_348.fds[1]);
  MallocMessageBuilder::MallocMessageBuilder(&local_128.super_MallocMessageBuilder,0,FIXED_SIZE);
  local_128.super_MallocMessageBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&PTR__TestMessageBuilder_00630a30;
  local_128.desiredSegmentCount = 10;
  MessageBuilder::getRootInternal((Builder *)&local_300,(MessageBuilder *)&local_128);
  PointerBuilder::getStruct
            ((StructBuilder *)&stack0xfffffffffffffd40,(PointerBuilder *)&stack0xfffffffffffffd68,
             (StructSize)0x140006,(word *)0x0);
  uVar9 = local_2a8 + 0x11;
  bVar6 = SUB81(local_2c0,0);
  uVar7 = (undefined7)((ulong)local_2c0 >> 8);
  PointerBuilder::initStructList
            (&local_300,(PointerBuilder *)&stack0xfffffffffffffd68,0x10,(StructSize)0x140006);
  if (local_300.elementCount != 0) {
    index = 0;
    uVar8 = pCStackY_2b8;
    do {
      ListBuilder::getStructElement((StructBuilder *)&stack0xfffffffffffffd68,&local_300,index);
      builder._builder.capTable._0_1_ = bVar6;
      builder._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffd60;
      builder._builder.capTable._1_7_ = uVar7;
      builder._builder.data = (void *)uVar8;
      builder._builder.pointers = (WirePointer *)uVar9;
      builder._builder._32_8_ = in_stack_fffffffffffffd80;
      initTestMessage(builder);
      index = index + 1;
    } while (local_300.elementCount != index);
  }
  local_340.impl.ptr = (Iface *)operator_new(0x18);
  (local_340.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00630d68;
  local_340.impl.ptr[1]._vptr_Iface = (_func_int **)&local_348;
  local_340.impl.ptr[2]._vptr_Iface = (_func_int **)&local_300;
  local_340.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<void()>::Impl<capnp::_::(anonymous_namespace)::TestCase321::run()::$_0>>
        ::instance;
  kj::Thread::Thread(&local_2d8,&local_340);
  pIVar3 = local_340.impl.ptr;
  if (local_340.impl.ptr != (Iface *)0x0) {
    local_340.impl.ptr = (Iface *)0x0;
    (**(local_340.impl.disposer)->_vptr_Disposer)
              (local_340.impl.disposer,pIVar3->_vptr_Iface[-2] + (long)&pIVar3->_vptr_Iface);
  }
  pAVar2 = local_350;
  AVar5 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_128);
  AVar5.size_ = (size_t)AVar5.ptr;
  AVar5.ptr = pAVar2;
  writeMessage((AsyncOutputStream *)&local_368,AVar5);
  bVar6 = false;
  kj::_::waitImpl(&local_368,(ExceptionOrValue *)&stack0xfffffffffffffd68,local_310);
  if (bVar6 != false) {
    kj::throwRecoverableException((Exception *)&stack0xfffffffffffffd70,0);
    if (bVar6 == true) {
      kj::Exception::~Exception((Exception *)&stack0xfffffffffffffd70);
    }
    pPVar1 = local_368.ptr;
    if (local_368.ptr != (PromiseNode *)0x0) {
      local_368.ptr = (PromiseNode *)0x0;
      (**(local_368.disposer)->_vptr_Disposer)
                (local_368.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode
                );
    }
    kj::Thread::~Thread(&local_2d8);
    TestMessageBuilder::~TestMessageBuilder(&local_128);
    pAVar2 = local_350;
    if (local_350 != (ArrayPtr<const_capnp::word> *)0x0) {
      local_350 = (ArrayPtr<const_capnp::word> *)0x0;
      (**(code **)*local_358)(local_358,(long)&pAVar2->ptr + pAVar2->ptr[-2].content);
    }
    plVar4 = local_318;
    if (local_318 != (long *)0x0) {
      local_318 = (long *)0x0;
      (**(code **)*local_320)(local_320,(long)plVar4 + *(long *)(*plVar4 + -0x10));
    }
    plVar4 = local_328;
    if (local_328 != (long *)0x0) {
      local_328 = (long *)0x0;
      (**(code **)*local_330)(local_330,(long)plVar4 + *(long *)(*plVar4 + -0x10));
    }
    PipeWithSmallBuffer::~PipeWithSmallBuffer(&local_348);
    return;
  }
  kj::_::unreachable();
}

Assistant:

TEST(Schema, Generics) {
  StructSchema allTypes = Schema::from<TestAllTypes>();
  StructSchema tap = Schema::from<test::TestAnyPointer>();
  StructSchema schema = Schema::from<test::TestUseGenerics>();

  StructSchema branded;

  {
    StructSchema::Field basic = schema.getFieldByName("basic");
    branded = basic.getType().asStruct();

    StructSchema::Field foo = branded.getFieldByName("foo");
    EXPECT_TRUE(foo.getType().asStruct() == allTypes);
    EXPECT_TRUE(foo.getType().asStruct() != tap);

    StructSchema instance2 = branded.getFieldByName("rev").getType().asStruct();
    StructSchema::Field foo2 = instance2.getFieldByName("foo");
    EXPECT_TRUE(foo2.getType().asStruct() == tap);
    EXPECT_TRUE(foo2.getType().asStruct() != allTypes);
  }

  {
    StructSchema inner2 = schema.getFieldByName("inner2").getType().asStruct();

    StructSchema bound = inner2.getFieldByName("innerBound").getType().asStruct();
    Type boundFoo = bound.getFieldByName("foo").getType();
    EXPECT_FALSE(boundFoo.isAnyPointer());
    EXPECT_TRUE(boundFoo.asStruct() == allTypes);

    StructSchema unbound = inner2.getFieldByName("innerUnbound").getType().asStruct();
    Type unboundFoo = unbound.getFieldByName("foo").getType();
    EXPECT_TRUE(unboundFoo.isAnyPointer());
  }

  {
    InterfaceSchema cap = schema.getFieldByName("genericCap").getType().asInterface();
    InterfaceSchema::Method method = cap.getMethodByName("call");

    StructSchema inner2 = method.getParamType();
    StructSchema bound = inner2.getFieldByName("innerBound").getType().asStruct();
    Type boundFoo = bound.getFieldByName("foo").getType();
    EXPECT_FALSE(boundFoo.isAnyPointer());
    EXPECT_TRUE(boundFoo.asStruct() == allTypes);
    EXPECT_TRUE(inner2.getFieldByName("baz").getType().isText());

    StructSchema results = method.getResultType();
    EXPECT_TRUE(results.getFieldByName("qux").getType().isData());

    EXPECT_TRUE(results.getFieldByName("gen").getType().asStruct() == branded);
  }
}